

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertARGBToUV_SSE2(uint32_t *argb,uint8_t *u,uint8_t *v,int src_width,int do_store)

{
  long lVar1;
  uint8_t uVar2;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  undefined1 auVar3 [16];
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  undefined1 auVar20 [16];
  uint8_t uVar35;
  __m128i rgb [6];
  __m128i V1;
  __m128i U1;
  __m128i local_d8;
  undefined1 local_c8 [16];
  __m128i local_b8;
  undefined1 local_a8 [16];
  __m128i local_98;
  undefined1 local_88 [16];
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  
  for (lVar1 = 0; lVar1 < (int)(src_width & 0xffffffe0); lVar1 = lVar1 + 0x20) {
    RGB32PackedToPlanar_SSE2(argb,&local_d8);
    auVar3 = pmaddwd((undefined1  [16])local_d8,_DAT_00123d90);
    auVar20 = pmaddwd(local_c8,_DAT_00123d90);
    local_d8 = (__m128i)packssdw(auVar3,auVar20);
    auVar3 = pmaddwd((undefined1  [16])local_b8,_DAT_00123d90);
    auVar20 = pmaddwd(local_a8,_DAT_00123d90);
    local_b8 = (__m128i)packssdw(auVar3,auVar20);
    auVar3 = pmaddwd((undefined1  [16])local_98,_DAT_00123d90);
    auVar20 = pmaddwd(local_88,_DAT_00123d90);
    local_98 = (__m128i)packssdw(auVar3,auVar20);
    ConvertRGBToUV_SSE2(&local_d8,&local_b8,&local_98,(__m128i *)&local_48,(__m128i *)&local_58);
    RGB32PackedToPlanar_SSE2(argb + 0x10,&local_d8);
    auVar3 = pmaddwd((undefined1  [16])local_d8,_DAT_00123d90);
    auVar20 = pmaddwd(local_c8,_DAT_00123d90);
    local_d8 = (__m128i)packssdw(auVar3,auVar20);
    auVar3 = pmaddwd((undefined1  [16])local_b8,_DAT_00123d90);
    auVar20 = pmaddwd(local_a8,_DAT_00123d90);
    local_b8 = (__m128i)packssdw(auVar3,auVar20);
    auVar3 = pmaddwd((undefined1  [16])local_98,_DAT_00123d90);
    auVar20 = pmaddwd(local_88,_DAT_00123d90);
    local_98 = (__m128i)packssdw(auVar3,auVar20);
    ConvertRGBToUV_SSE2(&local_d8,&local_b8,&local_98,(__m128i *)&local_68,(__m128i *)&local_78);
    uVar2 = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
    uVar4 = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    uVar5 = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    uVar6 = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
    uVar7 = (0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 - (0xff < sStack_40);
    uVar8 = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
    uVar9 = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
    uVar10 = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    uVar11 = (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68);
    uVar12 = (0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66);
    uVar13 = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
    uVar14 = (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62);
    uVar15 = (0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60);
    uVar16 = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
    uVar17 = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
    uVar18 = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    uVar19 = (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58);
    uVar21 = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
    uVar22 = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    uVar23 = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
    uVar24 = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
    uVar25 = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    uVar26 = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    uVar27 = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    uVar28 = (0 < local_78) * (local_78 < 0x100) * (char)local_78 - (0xff < local_78);
    uVar29 = (0 < sStack_76) * (sStack_76 < 0x100) * (char)sStack_76 - (0xff < sStack_76);
    uVar30 = (0 < sStack_74) * (sStack_74 < 0x100) * (char)sStack_74 - (0xff < sStack_74);
    uVar31 = (0 < sStack_72) * (sStack_72 < 0x100) * (char)sStack_72 - (0xff < sStack_72);
    uVar32 = (0 < sStack_70) * (sStack_70 < 0x100) * (char)sStack_70 - (0xff < sStack_70);
    uVar33 = (0 < sStack_6e) * (sStack_6e < 0x100) * (char)sStack_6e - (0xff < sStack_6e);
    uVar34 = (0 < sStack_6c) * (sStack_6c < 0x100) * (char)sStack_6c - (0xff < sStack_6c);
    uVar35 = (0 < sStack_6a) * (sStack_6a < 0x100) * (char)sStack_6a - (0xff < sStack_6a);
    if (do_store == 0) {
      uVar2 = pavgb(uVar2,*u);
      uVar4 = pavgb(uVar4,u[1]);
      uVar5 = pavgb(uVar5,u[2]);
      uVar6 = pavgb(uVar6,u[3]);
      uVar7 = pavgb(uVar7,u[4]);
      uVar8 = pavgb(uVar8,u[5]);
      uVar9 = pavgb(uVar9,u[6]);
      uVar10 = pavgb(uVar10,u[7]);
      uVar11 = pavgb(uVar11,u[8]);
      uVar12 = pavgb(uVar12,u[9]);
      uVar13 = pavgb(uVar13,u[10]);
      uVar14 = pavgb(uVar14,u[0xb]);
      uVar15 = pavgb(uVar15,u[0xc]);
      uVar16 = pavgb(uVar16,u[0xd]);
      uVar17 = pavgb(uVar17,u[0xe]);
      uVar18 = pavgb(uVar18,u[0xf]);
      uVar19 = pavgb(uVar19,*v);
      uVar21 = pavgb(uVar21,v[1]);
      uVar22 = pavgb(uVar22,v[2]);
      uVar23 = pavgb(uVar23,v[3]);
      uVar24 = pavgb(uVar24,v[4]);
      uVar25 = pavgb(uVar25,v[5]);
      uVar26 = pavgb(uVar26,v[6]);
      uVar27 = pavgb(uVar27,v[7]);
      uVar28 = pavgb(uVar28,v[8]);
      uVar29 = pavgb(uVar29,v[9]);
      uVar30 = pavgb(uVar30,v[10]);
      uVar31 = pavgb(uVar31,v[0xb]);
      uVar32 = pavgb(uVar32,v[0xc]);
      uVar33 = pavgb(uVar33,v[0xd]);
      uVar34 = pavgb(uVar34,v[0xe]);
      uVar35 = pavgb(uVar35,v[0xf]);
    }
    *u = uVar2;
    u[1] = uVar4;
    u[2] = uVar5;
    u[3] = uVar6;
    u[4] = uVar7;
    u[5] = uVar8;
    u[6] = uVar9;
    u[7] = uVar10;
    u[8] = uVar11;
    u[9] = uVar12;
    u[10] = uVar13;
    u[0xb] = uVar14;
    u[0xc] = uVar15;
    u[0xd] = uVar16;
    u[0xe] = uVar17;
    u[0xf] = uVar18;
    *v = uVar19;
    v[1] = uVar21;
    v[2] = uVar22;
    v[3] = uVar23;
    v[4] = uVar24;
    v[5] = uVar25;
    v[6] = uVar26;
    v[7] = uVar27;
    v[8] = uVar28;
    v[9] = uVar29;
    v[10] = uVar30;
    v[0xb] = uVar31;
    v[0xc] = uVar32;
    v[0xd] = uVar33;
    v[0xe] = uVar34;
    v[0xf] = uVar35;
    u = u + 0x10;
    v = v + 0x10;
    argb = argb + 0x20;
  }
  if ((int)lVar1 < src_width) {
    WebPConvertARGBToUV_C(argb,u,v,src_width - (int)lVar1,do_store);
    return;
  }
  return;
}

Assistant:

static void ConvertARGBToUV_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                 uint8_t* WEBP_RESTRICT u,
                                 uint8_t* WEBP_RESTRICT v,
                                 int src_width, int do_store) {
  const int max_width = src_width & ~31;
  int i;
  for (i = 0; i < max_width; i += 32, u += 16, v += 16) {
    __m128i rgb[6], U0, V0, U1, V1;
    RGB32PackedToPlanar_SSE2(&argb[i], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U0, &V0);

    RGB32PackedToPlanar_SSE2(&argb[i + 16], rgb);
    HorizontalAddPack_SSE2(&rgb[0], &rgb[1], &rgb[0]);
    HorizontalAddPack_SSE2(&rgb[2], &rgb[3], &rgb[2]);
    HorizontalAddPack_SSE2(&rgb[4], &rgb[5], &rgb[4]);
    ConvertRGBToUV_SSE2(&rgb[0], &rgb[2], &rgb[4], &U1, &V1);

    U0 = _mm_packus_epi16(U0, U1);
    V0 = _mm_packus_epi16(V0, V1);
    if (!do_store) {
      const __m128i prev_u = LOAD_16(u);
      const __m128i prev_v = LOAD_16(v);
      U0 = _mm_avg_epu8(U0, prev_u);
      V0 = _mm_avg_epu8(V0, prev_v);
    }
    STORE_16(U0, u);
    STORE_16(V0, v);
  }
  if (i < src_width) {  // left-over
    WebPConvertARGBToUV_C(argb + i, u, v, src_width - i, do_store);
  }
}